

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O1

void aom_highbd_blend_a64_d16_mask_sse4_1
               (uint8_t *dst8,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params,int bd)

{
  short sVar1;
  short sVar8;
  short sVar12;
  ushort *puVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  short sVar25;
  short sVar26;
  char cVar27;
  char cVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  unkbyte10 Var53;
  unkbyte10 Var54;
  unkbyte10 Var55;
  unkbyte10 Var56;
  int iVar57;
  int iVar58;
  int iVar59;
  ushort *puVar60;
  long lVar61;
  uint uVar62;
  uint8_t *puVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  undefined1 auVar68 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar69 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 in_XMM4 [16];
  byte bVar77;
  byte bVar78;
  byte bVar79;
  byte bVar80;
  byte bVar81;
  byte bVar82;
  undefined1 in_XMM5 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  byte bVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  short sVar95;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  int iVar104;
  undefined1 in_XMM9 [16];
  undefined1 auVar110 [16];
  int iVar105;
  int iVar106;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  int iVar114;
  undefined1 auVar115 [12];
  undefined1 in_XMM10 [16];
  undefined1 auVar118 [16];
  undefined1 auVar116 [12];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  int iVar122;
  undefined1 auVar123 [12];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar124 [12];
  undefined1 auVar125 [12];
  undefined1 auVar127 [12];
  undefined1 auVar138 [16];
  undefined1 auVar128 [12];
  undefined1 auVar140 [16];
  int iVar141;
  undefined1 auVar142 [12];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar151 [16];
  undefined1 auVar143 [12];
  undefined1 auVar144 [12];
  undefined1 auVar146 [12];
  undefined1 auVar156 [16];
  undefined1 auVar147 [12];
  undefined1 auVar158 [16];
  undefined1 auVar159 [12];
  undefined1 auVar160 [12];
  undefined1 auVar161 [12];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar172 [12];
  undefined1 auVar173 [12];
  undefined1 auVar174 [16];
  undefined1 auVar177 [12];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar13;
  short sVar14;
  short sVar15;
  undefined1 auVar107 [12];
  undefined1 auVar108 [12];
  undefined1 auVar109 [12];
  undefined1 auVar111 [16];
  undefined1 auVar117 [12];
  undefined1 auVar119 [16];
  undefined1 auVar126 [12];
  undefined1 auVar132 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar139 [16];
  undefined1 auVar145 [12];
  undefined1 auVar150 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  undefined1 auVar162 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar179 [16];
  
  auVar69 = _DAT_004c9fd0;
  iVar64 = conv_params->round_1 + conv_params->round_0;
  cVar28 = (char)iVar64;
  cVar27 = (byte)bd - cVar28;
  iVar59 = (1 << (0xdU - cVar28 & 0x1f)) + (-1 << (cVar27 + 0xdU & 0x1f)) +
           (-1 << (cVar27 + 0xeU & 0x1f));
  uVar62 = 0x14 - iVar64;
  auVar68 = ZEXT416(-1 << ((byte)bd & 0x1f) ^ 0xffffffff);
  puVar60 = (ushort *)((long)dst8 * 2);
  iVar64 = iVar59 * 0x40;
  iVar66 = iVar59 * 0x40;
  iVar67 = iVar59 * 0x40;
  iVar59 = iVar59 * 0x40;
  auVar68 = pshuflw(auVar68,auVar68,0);
  sVar25 = auVar68._0_2_;
  sVar26 = auVar68._2_2_;
  if (subh == 0 && subw == 0) {
    if (w == 8) {
      auVar69 = pmovsxbw(in_XMM2,0x4040404040404040);
      auVar68 = ZEXT416(uVar62);
      do {
        auVar180 = pmovzxbw(in_XMM9,*(undefined8 *)mask);
        auVar182 = pmovzxbw(in_XMM10,*(undefined8 *)(mask + mask_stride));
        auVar73 = *(undefined1 (*) [16])src0;
        auVar130 = *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + (long)(int)src0_stride * 2);
        auVar70 = *(undefined1 (*) [16])src1;
        auVar71 = *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)(int)src1_stride * 2);
        auVar164._0_2_ = auVar69._0_2_ - auVar180._0_2_;
        auVar164._2_2_ = auVar69._2_2_ - auVar180._2_2_;
        auVar164._4_2_ = auVar69._4_2_ - auVar180._4_2_;
        auVar164._6_2_ = auVar69._6_2_ - auVar180._6_2_;
        auVar164._8_2_ = auVar69._8_2_ - auVar180._8_2_;
        auVar164._10_2_ = auVar69._10_2_ - auVar180._10_2_;
        auVar164._12_2_ = auVar69._12_2_ - auVar180._12_2_;
        auVar164._14_2_ = auVar69._14_2_ - auVar180._14_2_;
        auVar72._0_2_ = auVar69._0_2_ - auVar182._0_2_;
        auVar72._2_2_ = auVar69._2_2_ - auVar182._2_2_;
        auVar72._4_2_ = auVar69._4_2_ - auVar182._4_2_;
        auVar72._6_2_ = auVar69._6_2_ - auVar182._6_2_;
        auVar72._8_2_ = auVar69._8_2_ - auVar182._8_2_;
        auVar72._10_2_ = auVar69._10_2_ - auVar182._10_2_;
        auVar72._12_2_ = auVar69._12_2_ - auVar182._12_2_;
        auVar72._14_2_ = auVar69._14_2_ - auVar182._14_2_;
        auVar165 = pmulhuw(auVar180,auVar73);
        sVar95 = auVar73._6_2_ * auVar180._6_2_;
        iVar105 = CONCAT22(auVar165._8_2_,auVar73._8_2_ * auVar180._8_2_);
        auVar108._0_8_ =
             CONCAT26(auVar165._10_2_,CONCAT24(auVar73._10_2_ * auVar180._10_2_,iVar105));
        auVar108._8_2_ = auVar73._12_2_ * auVar180._12_2_;
        auVar108._10_2_ = auVar165._12_2_;
        auVar181._12_2_ = auVar73._14_2_ * auVar180._14_2_;
        auVar181._0_12_ = auVar108;
        auVar181._14_2_ = auVar165._14_2_;
        iVar65 = CONCAT22(auVar165._6_2_,sVar95);
        Var53 = CONCAT64(CONCAT42(iVar65,auVar165._4_2_),
                         CONCAT22(auVar73._4_2_ * auVar180._4_2_,sVar95));
        auVar37._4_8_ = (long)((unkuint10)Var53 >> 0x10);
        auVar37._2_2_ = auVar165._2_2_;
        auVar37._0_2_ = auVar73._2_2_ * auVar180._2_2_;
        auVar166 = pmulhuw(auVar164,auVar70);
        sVar95 = auVar164._6_2_ * auVar70._6_2_;
        iVar114 = CONCAT22(auVar166._8_2_,auVar164._8_2_ * auVar70._8_2_);
        auVar125._0_8_ =
             CONCAT26(auVar166._10_2_,CONCAT24(auVar164._10_2_ * auVar70._10_2_,iVar114));
        auVar125._8_2_ = auVar164._12_2_ * auVar70._12_2_;
        auVar125._10_2_ = auVar166._12_2_;
        auVar169._12_2_ = auVar164._14_2_ * auVar70._14_2_;
        auVar169._0_12_ = auVar125;
        auVar169._14_2_ = auVar166._14_2_;
        iVar57 = CONCAT22(auVar166._6_2_,sVar95);
        Var54 = CONCAT64(CONCAT42(iVar57,auVar166._4_2_),
                         CONCAT22(auVar164._4_2_ * auVar70._4_2_,sVar95));
        auVar38._4_8_ = (long)((unkuint10)Var54 >> 0x10);
        auVar38._2_2_ = auVar166._2_2_;
        auVar38._0_2_ = auVar164._2_2_ * auVar70._2_2_;
        auVar167 = pmulhuw(auVar182,auVar130);
        sVar95 = auVar130._6_2_ * auVar182._6_2_;
        iVar106 = CONCAT22(auVar167._8_2_,auVar130._8_2_ * auVar182._8_2_);
        auVar116._0_8_ =
             CONCAT26(auVar167._10_2_,CONCAT24(auVar130._10_2_ * auVar182._10_2_,iVar106));
        auVar116._8_2_ = auVar130._12_2_ * auVar182._12_2_;
        auVar116._10_2_ = auVar167._12_2_;
        auVar183._12_2_ = auVar130._14_2_ * auVar182._14_2_;
        auVar183._0_12_ = auVar116;
        auVar183._14_2_ = auVar167._14_2_;
        iVar58 = CONCAT22(auVar167._6_2_,sVar95);
        Var55 = CONCAT64(CONCAT42(iVar58,auVar167._4_2_),
                         CONCAT22(auVar130._4_2_ * auVar182._4_2_,sVar95));
        auVar39._4_8_ = (long)((unkuint10)Var55 >> 0x10);
        auVar39._2_2_ = auVar167._2_2_;
        auVar39._0_2_ = auVar130._2_2_ * auVar182._2_2_;
        auVar168 = pmulhuw(auVar72,auVar71);
        sVar95 = auVar72._6_2_ * auVar71._6_2_;
        iVar122 = CONCAT22(auVar168._8_2_,auVar72._8_2_ * auVar71._8_2_);
        auVar144._0_8_ = CONCAT26(auVar168._10_2_,CONCAT24(auVar72._10_2_ * auVar71._10_2_,iVar122))
        ;
        auVar144._8_2_ = auVar72._12_2_ * auVar71._12_2_;
        auVar144._10_2_ = auVar168._12_2_;
        auVar153._12_2_ = auVar72._14_2_ * auVar71._14_2_;
        auVar153._0_12_ = auVar144;
        auVar153._14_2_ = auVar168._14_2_;
        iVar104 = CONCAT22(auVar168._6_2_,sVar95);
        Var56 = CONCAT64(CONCAT42(iVar104,auVar168._4_2_),
                         CONCAT22(auVar72._4_2_ * auVar71._4_2_,sVar95));
        auVar40._4_8_ = (long)((unkuint10)Var56 >> 0x10);
        auVar40._2_2_ = auVar168._2_2_;
        auVar40._0_2_ = auVar72._2_2_ * auVar71._2_2_;
        in_XMM9._0_4_ = iVar105 + iVar64 + iVar114 >> auVar68;
        in_XMM9._4_4_ =
             (int)((ulong)auVar108._0_8_ >> 0x20) + iVar66 + (int)((ulong)auVar125._0_8_ >> 0x20) >>
             auVar68;
        in_XMM9._8_4_ = auVar108._8_4_ + iVar67 + auVar125._8_4_ >> auVar68;
        in_XMM9._12_4_ = auVar181._12_4_ + iVar59 + auVar169._12_4_ >> auVar68;
        auVar73._0_4_ =
             CONCAT22(auVar165._0_2_,auVar73._0_2_ * auVar180._0_2_) + iVar64 +
             CONCAT22(auVar166._0_2_,auVar164._0_2_ * auVar70._0_2_) >> auVar68;
        auVar73._4_4_ = auVar37._0_4_ + iVar66 + auVar38._0_4_ >> auVar68;
        auVar73._8_4_ =
             (int)((unkuint10)Var53 >> 0x10) + iVar67 + (int)((unkuint10)Var54 >> 0x10) >> auVar68;
        auVar73._12_4_ = iVar65 + iVar59 + iVar57 >> auVar68;
        auVar73 = packssdw(auVar73,in_XMM9);
        in_XMM10._0_4_ = iVar106 + iVar64 + iVar122 >> auVar68;
        in_XMM10._4_4_ =
             (int)((ulong)auVar116._0_8_ >> 0x20) + iVar66 + (int)((ulong)auVar144._0_8_ >> 0x20) >>
             auVar68;
        in_XMM10._8_4_ = auVar116._8_4_ + iVar67 + auVar144._8_4_ >> auVar68;
        in_XMM10._12_4_ = auVar183._12_4_ + iVar59 + auVar153._12_4_ >> auVar68;
        auVar130._0_4_ =
             CONCAT22(auVar167._0_2_,auVar130._0_2_ * auVar182._0_2_) + iVar64 +
             CONCAT22(auVar168._0_2_,auVar72._0_2_ * auVar71._0_2_) >> auVar68;
        auVar130._4_4_ = auVar39._0_4_ + iVar66 + auVar40._0_4_ >> auVar68;
        auVar130._8_4_ =
             (int)((unkuint10)Var55 >> 0x10) + iVar67 + (int)((unkuint10)Var56 >> 0x10) >> auVar68;
        auVar130._12_4_ = iVar58 + iVar59 + iVar104 >> auVar68;
        auVar130 = packssdw(auVar130,in_XMM10);
        sVar2 = (ushort)(-1 < auVar73._0_2_) * auVar73._0_2_;
        sVar3 = (ushort)(-1 < auVar73._2_2_) * auVar73._2_2_;
        sVar4 = (ushort)(-1 < auVar73._4_2_) * auVar73._4_2_;
        sVar5 = (ushort)(-1 < auVar73._6_2_) * auVar73._6_2_;
        sVar6 = (ushort)(-1 < auVar73._8_2_) * auVar73._8_2_;
        sVar7 = (ushort)(-1 < auVar73._10_2_) * auVar73._10_2_;
        sVar95 = (ushort)(-1 < auVar73._12_2_) * auVar73._12_2_;
        sVar1 = (ushort)(-1 < auVar73._14_2_) * auVar73._14_2_;
        sVar8 = (ushort)(-1 < auVar130._0_2_) * auVar130._0_2_;
        sVar9 = (ushort)(-1 < auVar130._2_2_) * auVar130._2_2_;
        sVar10 = (ushort)(-1 < auVar130._4_2_) * auVar130._4_2_;
        sVar11 = (ushort)(-1 < auVar130._6_2_) * auVar130._6_2_;
        sVar15 = (ushort)(-1 < auVar130._8_2_) * auVar130._8_2_;
        sVar14 = (ushort)(-1 < auVar130._10_2_) * auVar130._10_2_;
        sVar13 = (ushort)(-1 < auVar130._12_2_) * auVar130._12_2_;
        sVar12 = (ushort)(-1 < auVar130._14_2_) * auVar130._14_2_;
        *puVar60 = (ushort)(sVar25 < sVar2) * sVar25 | (ushort)(sVar25 >= sVar2) * sVar2;
        puVar60[1] = (ushort)(sVar26 < sVar3) * sVar26 | (ushort)(sVar26 >= sVar3) * sVar3;
        puVar60[2] = (ushort)(sVar25 < sVar4) * sVar25 | (ushort)(sVar25 >= sVar4) * sVar4;
        puVar60[3] = (ushort)(sVar26 < sVar5) * sVar26 | (ushort)(sVar26 >= sVar5) * sVar5;
        puVar60[4] = (ushort)(sVar25 < sVar6) * sVar25 | (ushort)(sVar25 >= sVar6) * sVar6;
        puVar60[5] = (ushort)(sVar26 < sVar7) * sVar26 | (ushort)(sVar26 >= sVar7) * sVar7;
        puVar60[6] = (ushort)(sVar25 < sVar95) * sVar25 | (ushort)(sVar25 >= sVar95) * sVar95;
        puVar60[7] = (ushort)(sVar26 < sVar1) * sVar26 | (ushort)(sVar26 >= sVar1) * sVar1;
        puVar16 = puVar60 + (int)dst_stride;
        *puVar16 = (ushort)(sVar25 < sVar8) * sVar25 | (ushort)(sVar25 >= sVar8) * sVar8;
        puVar16[1] = (ushort)(sVar26 < sVar9) * sVar26 | (ushort)(sVar26 >= sVar9) * sVar9;
        puVar16[2] = (ushort)(sVar25 < sVar10) * sVar25 | (ushort)(sVar25 >= sVar10) * sVar10;
        puVar16[3] = (ushort)(sVar26 < sVar11) * sVar26 | (ushort)(sVar26 >= sVar11) * sVar11;
        puVar16[4] = (ushort)(sVar25 < sVar15) * sVar25 | (ushort)(sVar25 >= sVar15) * sVar15;
        puVar16[5] = (ushort)(sVar26 < sVar14) * sVar26 | (ushort)(sVar26 >= sVar14) * sVar14;
        puVar16[6] = (ushort)(sVar25 < sVar13) * sVar25 | (ushort)(sVar25 >= sVar13) * sVar13;
        puVar16[7] = (ushort)(sVar26 < sVar12) * sVar26 | (ushort)(sVar26 >= sVar12) * sVar12;
        mask = mask + mask_stride * 2;
        src1 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src1 + (ulong)(src1_stride * 2) * 2);
        src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src0 + (ulong)(src0_stride * 2) * 2);
        puVar60 = puVar60 + dst_stride * 2;
        h = h + -2;
      } while (h != 0);
    }
    else if (w == 4) {
      auVar69 = ZEXT416(uVar62);
      auVar68 = pmovsxbw(in_XMM3,0x4040404040404040);
      do {
        auVar74._4_4_ = *(undefined4 *)mask;
        auVar74._0_4_ = *(undefined4 *)(mask + mask_stride);
        auVar74._8_8_ = 0;
        auVar84._4_4_ = *(undefined4 *)(mask + mask_stride * 2);
        auVar84._0_4_ = *(undefined4 *)(mask + mask_stride * 3);
        auVar84._8_8_ = 0;
        auVar73 = pmovzxbw(in_XMM10,auVar74);
        auVar130 = pmovzxbw(in_XMM9,auVar84);
        uVar17 = *(undefined8 *)(src0 + (int)src0_stride);
        uVar18 = *(undefined8 *)src0;
        auVar75._8_8_ = uVar18;
        auVar75._0_8_ = uVar17;
        uVar19 = *(undefined8 *)(src0 + (int)(src0_stride * 2));
        uVar20 = *(undefined8 *)(src0 + (int)(src0_stride * 3));
        auVar85._8_8_ = uVar19;
        auVar85._0_8_ = uVar20;
        uVar21 = *(undefined8 *)(src1 + (int)src1_stride);
        uVar22 = *(undefined8 *)src1;
        auVar151._8_8_ = uVar22;
        auVar151._0_8_ = uVar21;
        uVar23 = *(undefined8 *)(src1 + (int)(src1_stride * 2));
        uVar24 = *(undefined8 *)(src1 + (int)(src1_stride * 3));
        auVar134._8_8_ = uVar23;
        auVar134._0_8_ = uVar24;
        auVar99._0_2_ = auVar68._0_2_ - auVar73._0_2_;
        auVar99._2_2_ = auVar68._2_2_ - auVar73._2_2_;
        auVar99._4_2_ = auVar68._4_2_ - auVar73._4_2_;
        auVar99._6_2_ = auVar68._6_2_ - auVar73._6_2_;
        auVar99._8_2_ = auVar68._8_2_ - auVar73._8_2_;
        auVar99._10_2_ = auVar68._10_2_ - auVar73._10_2_;
        auVar99._12_2_ = auVar68._12_2_ - auVar73._12_2_;
        auVar99._14_2_ = auVar68._14_2_ - auVar73._14_2_;
        auVar90._0_2_ = auVar68._0_2_ - auVar130._0_2_;
        auVar90._2_2_ = auVar68._2_2_ - auVar130._2_2_;
        auVar90._4_2_ = auVar68._4_2_ - auVar130._4_2_;
        auVar90._6_2_ = auVar68._6_2_ - auVar130._6_2_;
        auVar90._8_2_ = auVar68._8_2_ - auVar130._8_2_;
        auVar90._10_2_ = auVar68._10_2_ - auVar130._10_2_;
        auVar90._12_2_ = auVar68._12_2_ - auVar130._12_2_;
        auVar90._14_2_ = auVar68._14_2_ - auVar130._14_2_;
        auVar70 = pmulhuw(auVar73,auVar75);
        sVar95 = (short)((ulong)uVar17 >> 0x30) * auVar73._6_2_;
        iVar105 = CONCAT22(auVar70._8_2_,(short)uVar18 * auVar73._8_2_);
        auVar115._0_8_ =
             CONCAT26(auVar70._10_2_,
                      CONCAT24((short)((ulong)uVar18 >> 0x10) * auVar73._10_2_,iVar105));
        auVar115._8_2_ = (short)((ulong)uVar18 >> 0x20) * auVar73._12_2_;
        auVar115._10_2_ = auVar70._12_2_;
        auVar119._12_2_ = (short)((ulong)uVar18 >> 0x30) * auVar73._14_2_;
        auVar119._0_12_ = auVar115;
        auVar119._14_2_ = auVar70._14_2_;
        iVar65 = CONCAT22(auVar70._6_2_,sVar95);
        Var53 = CONCAT64(CONCAT42(iVar65,auVar70._4_2_),
                         CONCAT22((short)((ulong)uVar17 >> 0x20) * auVar73._4_2_,sVar95));
        auVar33._4_8_ = (long)((unkuint10)Var53 >> 0x10);
        auVar33._2_2_ = auVar70._2_2_;
        auVar33._0_2_ = (short)((ulong)uVar17 >> 0x10) * auVar73._2_2_;
        auVar71 = pmulhuw(auVar99,auVar151);
        sVar95 = auVar99._6_2_ * (short)((ulong)uVar21 >> 0x30);
        iVar114 = CONCAT22(auVar71._8_2_,auVar99._8_2_ * (short)uVar22);
        auVar143._0_8_ =
             CONCAT26(auVar71._10_2_,
                      CONCAT24(auVar99._10_2_ * (short)((ulong)uVar22 >> 0x10),iVar114));
        auVar143._8_2_ = auVar99._12_2_ * (short)((ulong)uVar22 >> 0x20);
        auVar143._10_2_ = auVar71._12_2_;
        auVar152._12_2_ = auVar99._14_2_ * (short)((ulong)uVar22 >> 0x30);
        auVar152._0_12_ = auVar143;
        auVar152._14_2_ = auVar71._14_2_;
        iVar57 = CONCAT22(auVar71._6_2_,sVar95);
        Var54 = CONCAT64(CONCAT42(iVar57,auVar71._4_2_),
                         CONCAT22(auVar99._4_2_ * (short)((ulong)uVar21 >> 0x20),sVar95));
        auVar34._4_8_ = (long)((unkuint10)Var54 >> 0x10);
        auVar34._2_2_ = auVar71._2_2_;
        auVar34._0_2_ = auVar99._2_2_ * (short)((ulong)uVar21 >> 0x10);
        auVar72 = pmulhuw(auVar130,auVar85);
        sVar95 = (short)((ulong)uVar20 >> 0x30) * auVar130._6_2_;
        iVar104 = CONCAT22(auVar72._8_2_,(short)uVar19 * auVar130._8_2_);
        auVar107._0_8_ =
             CONCAT26(auVar72._10_2_,
                      CONCAT24((short)((ulong)uVar19 >> 0x10) * auVar130._10_2_,iVar104));
        auVar107._8_2_ = (short)((ulong)uVar19 >> 0x20) * auVar130._12_2_;
        auVar107._10_2_ = auVar72._12_2_;
        auVar111._12_2_ = (short)((ulong)uVar19 >> 0x30) * auVar130._14_2_;
        auVar111._0_12_ = auVar107;
        auVar111._14_2_ = auVar72._14_2_;
        iVar58 = CONCAT22(auVar72._6_2_,sVar95);
        Var55 = CONCAT64(CONCAT42(iVar58,auVar72._4_2_),
                         CONCAT22((short)((ulong)uVar20 >> 0x20) * auVar130._4_2_,sVar95));
        auVar35._4_8_ = (long)((unkuint10)Var55 >> 0x10);
        auVar35._2_2_ = auVar72._2_2_;
        auVar35._0_2_ = (short)((ulong)uVar20 >> 0x10) * auVar130._2_2_;
        auVar164 = pmulhuw(auVar90,auVar134);
        sVar95 = auVar90._6_2_ * (short)((ulong)uVar24 >> 0x30);
        iVar106 = CONCAT22(auVar164._8_2_,auVar90._8_2_ * (short)uVar23);
        auVar124._0_8_ =
             CONCAT26(auVar164._10_2_,
                      CONCAT24(auVar90._10_2_ * (short)((ulong)uVar23 >> 0x10),iVar106));
        auVar124._8_2_ = auVar90._12_2_ * (short)((ulong)uVar23 >> 0x20);
        auVar124._10_2_ = auVar164._12_2_;
        auVar135._12_2_ = auVar90._14_2_ * (short)((ulong)uVar23 >> 0x30);
        auVar135._0_12_ = auVar124;
        auVar135._14_2_ = auVar164._14_2_;
        in_XMM10._0_4_ = iVar105 + iVar64 + iVar114 >> auVar69;
        in_XMM10._4_4_ =
             (int)((ulong)auVar115._0_8_ >> 0x20) + iVar66 + (int)((ulong)auVar143._0_8_ >> 0x20) >>
             auVar69;
        in_XMM10._8_4_ = auVar115._8_4_ + iVar67 + auVar143._8_4_ >> auVar69;
        in_XMM10._12_4_ = auVar119._12_4_ + iVar59 + auVar152._12_4_ >> auVar69;
        in_XMM9._0_4_ = iVar104 + iVar64 + iVar106 >> auVar69;
        in_XMM9._4_4_ =
             (int)((ulong)auVar107._0_8_ >> 0x20) + iVar66 + (int)((ulong)auVar124._0_8_ >> 0x20) >>
             auVar69;
        in_XMM9._8_4_ = auVar107._8_4_ + iVar67 + auVar124._8_4_ >> auVar69;
        in_XMM9._12_4_ = auVar111._12_4_ + iVar59 + auVar135._12_4_ >> auVar69;
        auVar76._0_4_ =
             CONCAT22(auVar70._0_2_,(short)uVar17 * auVar73._0_2_) + iVar64 +
             CONCAT22(auVar71._0_2_,auVar99._0_2_ * (short)uVar21) >> auVar69;
        auVar76._4_4_ = auVar33._0_4_ + iVar66 + auVar34._0_4_ >> auVar69;
        auVar76._8_4_ =
             (int)((unkuint10)Var53 >> 0x10) + iVar67 + (int)((unkuint10)Var54 >> 0x10) >> auVar69;
        auVar76._12_4_ = iVar65 + iVar59 + iVar57 >> auVar69;
        iVar65 = CONCAT22(auVar164._6_2_,sVar95);
        Var53 = CONCAT64(CONCAT42(iVar65,auVar164._4_2_),
                         CONCAT22(auVar90._4_2_ * (short)((ulong)uVar24 >> 0x20),sVar95));
        auVar36._4_8_ = (long)((unkuint10)Var53 >> 0x10);
        auVar36._2_2_ = auVar164._2_2_;
        auVar36._0_2_ = auVar90._2_2_ * (short)((ulong)uVar24 >> 0x10);
        auVar73 = packssdw(auVar76,in_XMM10);
        auVar86._0_4_ =
             CONCAT22(auVar72._0_2_,(short)uVar20 * auVar130._0_2_) + iVar64 +
             CONCAT22(auVar164._0_2_,auVar90._0_2_ * (short)uVar24) >> auVar69;
        auVar86._4_4_ = auVar35._0_4_ + iVar66 + auVar36._0_4_ >> auVar69;
        auVar86._8_4_ =
             (int)((unkuint10)Var55 >> 0x10) + iVar67 + (int)((unkuint10)Var53 >> 0x10) >> auVar69;
        auVar86._12_4_ = iVar58 + iVar59 + iVar65 >> auVar69;
        sVar95 = (ushort)(-1 < auVar73._0_2_) * auVar73._0_2_;
        sVar1 = (ushort)(-1 < auVar73._2_2_) * auVar73._2_2_;
        sVar2 = (ushort)(-1 < auVar73._4_2_) * auVar73._4_2_;
        sVar3 = (ushort)(-1 < auVar73._6_2_) * auVar73._6_2_;
        sVar7 = (ushort)(-1 < auVar73._8_2_) * auVar73._8_2_;
        sVar6 = (ushort)(-1 < auVar73._10_2_) * auVar73._10_2_;
        sVar5 = (ushort)(-1 < auVar73._12_2_) * auVar73._12_2_;
        sVar4 = (ushort)(-1 < auVar73._14_2_) * auVar73._14_2_;
        puVar60[4] = (ushort)(sVar25 < sVar7) * sVar25 | (ushort)(sVar25 >= sVar7) * sVar7;
        puVar60[5] = (ushort)(sVar26 < sVar6) * sVar26 | (ushort)(sVar26 >= sVar6) * sVar6;
        puVar60[6] = (ushort)(sVar25 < sVar5) * sVar25 | (ushort)(sVar25 >= sVar5) * sVar5;
        puVar60[7] = (ushort)(sVar26 < sVar4) * sVar26 | (ushort)(sVar26 >= sVar4) * sVar4;
        auVar73 = packssdw(auVar86,in_XMM9);
        sVar5 = (ushort)(-1 < auVar73._0_2_) * auVar73._0_2_;
        sVar6 = (ushort)(-1 < auVar73._2_2_) * auVar73._2_2_;
        sVar7 = (ushort)(-1 < auVar73._4_2_) * auVar73._4_2_;
        sVar8 = (ushort)(-1 < auVar73._6_2_) * auVar73._6_2_;
        sVar9 = (ushort)(-1 < auVar73._8_2_) * auVar73._8_2_;
        sVar10 = (ushort)(-1 < auVar73._10_2_) * auVar73._10_2_;
        sVar4 = (ushort)(-1 < auVar73._12_2_) * auVar73._12_2_;
        sVar11 = (ushort)(-1 < auVar73._14_2_) * auVar73._14_2_;
        puVar16 = puVar60 + (int)dst_stride;
        *puVar16 = (ushort)(sVar25 < sVar95) * sVar25 | (ushort)(sVar25 >= sVar95) * sVar95;
        puVar16[1] = (ushort)(sVar26 < sVar1) * sVar26 | (ushort)(sVar26 >= sVar1) * sVar1;
        puVar16[2] = (ushort)(sVar25 < sVar2) * sVar25 | (ushort)(sVar25 >= sVar2) * sVar2;
        puVar16[3] = (ushort)(sVar26 < sVar3) * sVar26 | (ushort)(sVar26 >= sVar3) * sVar3;
        puVar60[(long)(int)(dst_stride * 2) + 4] =
             (ushort)(sVar25 < sVar9) * sVar25 | (ushort)(sVar25 >= sVar9) * sVar9;
        puVar60[(long)(int)(dst_stride * 2) + 5] =
             (ushort)(sVar26 < sVar10) * sVar26 | (ushort)(sVar26 >= sVar10) * sVar10;
        puVar60[(long)(int)(dst_stride * 2) + 6] =
             (ushort)(sVar25 < sVar4) * sVar25 | (ushort)(sVar25 >= sVar4) * sVar4;
        puVar60[(long)(int)(dst_stride * 2) + 7] =
             (ushort)(sVar26 < sVar11) * sVar26 | (ushort)(sVar26 >= sVar11) * sVar11;
        puVar16 = puVar60 + (int)(dst_stride * 3);
        *puVar16 = (ushort)(sVar25 < sVar5) * sVar25 | (ushort)(sVar25 >= sVar5) * sVar5;
        puVar16[1] = (ushort)(sVar26 < sVar6) * sVar26 | (ushort)(sVar26 >= sVar6) * sVar6;
        puVar16[2] = (ushort)(sVar25 < sVar7) * sVar25 | (ushort)(sVar25 >= sVar7) * sVar7;
        puVar16[3] = (ushort)(sVar26 < sVar8) * sVar26 | (ushort)(sVar26 >= sVar8) * sVar8;
        mask = mask + (mask_stride << 2);
        src1 = src1 + (src1_stride << 2);
        src0 = src0 + (src0_stride << 2);
        puVar60 = puVar60 + (dst_stride << 2);
        h = h + -4;
      } while (h != 0);
    }
    else if (0 < h) {
      iVar65 = 0;
      auVar69 = pmovsxbw(in_XMM3,0x4040404040404040);
      auVar68 = ZEXT416(uVar62);
      do {
        if (0 < w) {
          lVar61 = 0;
          do {
            auVar73 = *(undefined1 (*) [16])(mask + lVar61);
            auVar72 = pmovzxbw(in_XMM10,auVar73);
            auVar180._0_2_ = CONCAT11(0,auVar73[8]);
            bVar77 = auVar73[9];
            auVar180[2] = bVar77;
            auVar180[3] = 0;
            bVar78 = auVar73[10];
            auVar180[4] = bVar78;
            auVar180[5] = 0;
            bVar79 = auVar73[0xb];
            auVar180[6] = bVar79;
            auVar180[7] = 0;
            bVar80 = auVar73[0xc];
            auVar180[8] = bVar80;
            auVar180[9] = 0;
            bVar81 = auVar73[0xd];
            auVar180[10] = bVar81;
            auVar180[0xb] = 0;
            bVar82 = auVar73[0xe];
            auVar180[0xc] = bVar82;
            auVar180[0xd] = 0;
            bVar83 = auVar73[0xf];
            auVar180[0xe] = bVar83;
            auVar180[0xf] = 0;
            auVar73 = *(undefined1 (*) [16])(src0 + lVar61);
            auVar130 = *(undefined1 (*) [16])(src0 + lVar61 + 8);
            auVar70 = *(undefined1 (*) [16])(src1 + lVar61);
            auVar71 = *(undefined1 (*) [16])(src1 + lVar61 + 8);
            auVar165._0_2_ = auVar69._0_2_ - auVar180._0_2_;
            auVar165._2_2_ = auVar69._2_2_ - (ushort)bVar77;
            auVar165._4_2_ = auVar69._4_2_ - (ushort)bVar78;
            auVar165._6_2_ = auVar69._6_2_ - (ushort)bVar79;
            auVar165._8_2_ = auVar69._8_2_ - (ushort)bVar80;
            auVar165._10_2_ = auVar69._10_2_ - (ushort)bVar81;
            auVar165._12_2_ = auVar69._12_2_ - (ushort)bVar82;
            auVar165._14_2_ = auVar69._14_2_ - (ushort)bVar83;
            auVar182._0_2_ = auVar69._0_2_ - auVar72._0_2_;
            auVar182._2_2_ = auVar69._2_2_ - auVar72._2_2_;
            auVar182._4_2_ = auVar69._4_2_ - auVar72._4_2_;
            auVar182._6_2_ = auVar69._6_2_ - auVar72._6_2_;
            auVar182._8_2_ = auVar69._8_2_ - auVar72._8_2_;
            auVar182._10_2_ = auVar69._10_2_ - auVar72._10_2_;
            auVar182._12_2_ = auVar69._12_2_ - auVar72._12_2_;
            auVar182._14_2_ = auVar69._14_2_ - auVar72._14_2_;
            auVar164 = pmulhuw(auVar180,auVar130);
            sVar95 = (ushort)bVar79 * auVar130._6_2_;
            iVar106 = CONCAT22(auVar164._8_2_,(ushort)bVar80 * auVar130._8_2_);
            auVar109._0_8_ =
                 CONCAT26(auVar164._10_2_,CONCAT24((ushort)bVar81 * auVar130._10_2_,iVar106));
            auVar109._8_2_ = (ushort)bVar82 * auVar130._12_2_;
            auVar109._10_2_ = auVar164._12_2_;
            auVar166._12_2_ = (ushort)bVar83 * auVar130._14_2_;
            auVar166._0_12_ = auVar109;
            auVar166._14_2_ = auVar164._14_2_;
            iVar57 = CONCAT22(auVar164._6_2_,sVar95);
            Var53 = CONCAT64(CONCAT42(iVar57,auVar164._4_2_),
                             CONCAT22((ushort)bVar78 * auVar130._4_2_,sVar95));
            auVar41._4_8_ = (long)((unkuint10)Var53 >> 0x10);
            auVar41._2_2_ = auVar164._2_2_;
            auVar41._0_2_ = (ushort)bVar77 * auVar130._2_2_;
            auVar181 = pmulhuw(auVar165,auVar71);
            sVar95 = auVar165._6_2_ * auVar71._6_2_;
            iVar141 = CONCAT22(auVar181._8_2_,auVar165._8_2_ * auVar71._8_2_);
            auVar145._0_8_ =
                 CONCAT26(auVar181._10_2_,CONCAT24(auVar165._10_2_ * auVar71._10_2_,iVar141));
            auVar145._8_2_ = auVar165._12_2_ * auVar71._12_2_;
            auVar145._10_2_ = auVar181._12_2_;
            auVar154._12_2_ = auVar165._14_2_ * auVar71._14_2_;
            auVar154._0_12_ = auVar145;
            auVar154._14_2_ = auVar181._14_2_;
            iVar58 = CONCAT22(auVar181._6_2_,sVar95);
            Var54 = CONCAT64(CONCAT42(iVar58,auVar181._4_2_),
                             CONCAT22(auVar165._4_2_ * auVar71._4_2_,sVar95));
            auVar42._4_8_ = (long)((unkuint10)Var54 >> 0x10);
            auVar42._2_2_ = auVar181._2_2_;
            auVar42._0_2_ = auVar165._2_2_ * auVar71._2_2_;
            auVar183 = pmulhuw(auVar72,auVar73);
            sVar95 = auVar73._6_2_ * auVar72._6_2_;
            iVar114 = CONCAT22(auVar183._8_2_,auVar73._8_2_ * auVar72._8_2_);
            auVar117._0_8_ =
                 CONCAT26(auVar183._10_2_,CONCAT24(auVar73._10_2_ * auVar72._10_2_,iVar114));
            auVar117._8_2_ = auVar73._12_2_ * auVar72._12_2_;
            auVar117._10_2_ = auVar183._12_2_;
            auVar168._12_2_ = auVar73._14_2_ * auVar72._14_2_;
            auVar168._0_12_ = auVar117;
            auVar168._14_2_ = auVar183._14_2_;
            iVar104 = CONCAT22(auVar183._6_2_,sVar95);
            Var55 = CONCAT64(CONCAT42(iVar104,auVar183._4_2_),
                             CONCAT22(auVar73._4_2_ * auVar72._4_2_,sVar95));
            auVar43._4_8_ = (long)((unkuint10)Var55 >> 0x10);
            auVar43._2_2_ = auVar183._2_2_;
            auVar43._0_2_ = auVar73._2_2_ * auVar72._2_2_;
            auVar169 = pmulhuw(auVar182,auVar70);
            sVar95 = auVar182._6_2_ * auVar70._6_2_;
            iVar122 = CONCAT22(auVar169._8_2_,auVar182._8_2_ * auVar70._8_2_);
            auVar126._0_8_ =
                 CONCAT26(auVar169._10_2_,CONCAT24(auVar182._10_2_ * auVar70._10_2_,iVar122));
            auVar126._8_2_ = auVar182._12_2_ * auVar70._12_2_;
            auVar126._10_2_ = auVar169._12_2_;
            auVar136._12_2_ = auVar182._14_2_ * auVar70._14_2_;
            auVar136._0_12_ = auVar126;
            auVar136._14_2_ = auVar169._14_2_;
            iVar105 = CONCAT22(auVar169._6_2_,sVar95);
            Var56 = CONCAT64(CONCAT42(iVar105,auVar169._4_2_),
                             CONCAT22(auVar182._4_2_ * auVar70._4_2_,sVar95));
            auVar44._4_8_ = (long)((unkuint10)Var56 >> 0x10);
            auVar44._2_2_ = auVar169._2_2_;
            auVar44._0_2_ = auVar182._2_2_ * auVar70._2_2_;
            auVar167._0_4_ = iVar106 + iVar64 + iVar141 >> auVar68;
            auVar167._4_4_ =
                 (int)((ulong)auVar109._0_8_ >> 0x20) + iVar66 +
                 (int)((ulong)auVar145._0_8_ >> 0x20) >> auVar68;
            auVar167._8_4_ = auVar109._8_4_ + iVar67 + auVar145._8_4_ >> auVar68;
            auVar167._12_4_ = auVar166._12_4_ + iVar59 + auVar154._12_4_ >> auVar68;
            auVar71._0_4_ =
                 CONCAT22(auVar164._0_2_,auVar180._0_2_ * auVar130._0_2_) + iVar64 +
                 CONCAT22(auVar181._0_2_,auVar165._0_2_ * auVar71._0_2_) >> auVar68;
            auVar71._4_4_ = auVar41._0_4_ + iVar66 + auVar42._0_4_ >> auVar68;
            auVar71._8_4_ =
                 (int)((unkuint10)Var53 >> 0x10) + iVar67 + (int)((unkuint10)Var54 >> 0x10) >>
                 auVar68;
            auVar71._12_4_ = iVar57 + iVar59 + iVar58 >> auVar68;
            auVar130 = packssdw(auVar71,auVar167);
            in_XMM10._0_4_ = iVar114 + iVar64 + iVar122 >> auVar68;
            in_XMM10._4_4_ =
                 (int)((ulong)auVar117._0_8_ >> 0x20) + iVar66 +
                 (int)((ulong)auVar126._0_8_ >> 0x20) >> auVar68;
            in_XMM10._8_4_ = auVar117._8_4_ + iVar67 + auVar126._8_4_ >> auVar68;
            in_XMM10._12_4_ = auVar168._12_4_ + iVar59 + auVar136._12_4_ >> auVar68;
            auVar70._0_4_ =
                 CONCAT22(auVar183._0_2_,auVar73._0_2_ * auVar72._0_2_) + iVar64 +
                 CONCAT22(auVar169._0_2_,auVar182._0_2_ * auVar70._0_2_) >> auVar68;
            auVar70._4_4_ = auVar43._0_4_ + iVar66 + auVar44._0_4_ >> auVar68;
            auVar70._8_4_ =
                 (int)((unkuint10)Var55 >> 0x10) + iVar67 + (int)((unkuint10)Var56 >> 0x10) >>
                 auVar68;
            auVar70._12_4_ = iVar104 + iVar59 + iVar105 >> auVar68;
            auVar73 = packssdw(auVar70,in_XMM10);
            sVar1 = (ushort)(-1 < auVar130._0_2_) * auVar130._0_2_;
            sVar2 = (ushort)(-1 < auVar130._2_2_) * auVar130._2_2_;
            sVar3 = (ushort)(-1 < auVar130._4_2_) * auVar130._4_2_;
            sVar95 = (ushort)(-1 < auVar130._6_2_) * auVar130._6_2_;
            sVar4 = (ushort)(-1 < auVar130._8_2_) * auVar130._8_2_;
            sVar5 = (ushort)(-1 < auVar130._10_2_) * auVar130._10_2_;
            sVar6 = (ushort)(-1 < auVar130._12_2_) * auVar130._12_2_;
            sVar7 = (ushort)(-1 < auVar130._14_2_) * auVar130._14_2_;
            sVar9 = (ushort)(-1 < auVar73._0_2_) * auVar73._0_2_;
            sVar14 = (ushort)(-1 < auVar73._2_2_) * auVar73._2_2_;
            sVar13 = (ushort)(-1 < auVar73._4_2_) * auVar73._4_2_;
            sVar12 = (ushort)(-1 < auVar73._6_2_) * auVar73._6_2_;
            sVar8 = (ushort)(-1 < auVar73._8_2_) * auVar73._8_2_;
            sVar10 = (ushort)(-1 < auVar73._10_2_) * auVar73._10_2_;
            sVar11 = (ushort)(-1 < auVar73._12_2_) * auVar73._12_2_;
            sVar15 = (ushort)(-1 < auVar73._14_2_) * auVar73._14_2_;
            puVar16 = puVar60 + lVar61;
            *puVar16 = (ushort)(sVar25 < sVar9) * sVar25 | (ushort)(sVar25 >= sVar9) * sVar9;
            puVar16[1] = (ushort)(sVar26 < sVar14) * sVar26 | (ushort)(sVar26 >= sVar14) * sVar14;
            puVar16[2] = (ushort)(sVar25 < sVar13) * sVar25 | (ushort)(sVar25 >= sVar13) * sVar13;
            puVar16[3] = (ushort)(sVar26 < sVar12) * sVar26 | (ushort)(sVar26 >= sVar12) * sVar12;
            puVar16[4] = (ushort)(sVar25 < sVar8) * sVar25 | (ushort)(sVar25 >= sVar8) * sVar8;
            puVar16[5] = (ushort)(sVar26 < sVar10) * sVar26 | (ushort)(sVar26 >= sVar10) * sVar10;
            puVar16[6] = (ushort)(sVar25 < sVar11) * sVar25 | (ushort)(sVar25 >= sVar11) * sVar11;
            puVar16[7] = (ushort)(sVar26 < sVar15) * sVar26 | (ushort)(sVar26 >= sVar15) * sVar15;
            puVar16 = puVar60 + lVar61 + 8;
            *puVar16 = (ushort)(sVar25 < sVar1) * sVar25 | (ushort)(sVar25 >= sVar1) * sVar1;
            puVar16[1] = (ushort)(sVar26 < sVar2) * sVar26 | (ushort)(sVar26 >= sVar2) * sVar2;
            puVar16[2] = (ushort)(sVar25 < sVar3) * sVar25 | (ushort)(sVar25 >= sVar3) * sVar3;
            puVar16[3] = (ushort)(sVar26 < sVar95) * sVar26 | (ushort)(sVar26 >= sVar95) * sVar95;
            puVar16[4] = (ushort)(sVar25 < sVar4) * sVar25 | (ushort)(sVar25 >= sVar4) * sVar4;
            puVar16[5] = (ushort)(sVar26 < sVar5) * sVar26 | (ushort)(sVar26 >= sVar5) * sVar5;
            puVar16[6] = (ushort)(sVar25 < sVar6) * sVar25 | (ushort)(sVar25 >= sVar6) * sVar6;
            puVar16[7] = (ushort)(sVar26 < sVar7) * sVar26 | (ushort)(sVar26 >= sVar7) * sVar7;
            lVar61 = lVar61 + 0x10;
          } while (lVar61 < w);
        }
        mask = mask + mask_stride;
        iVar65 = iVar65 + 1;
        src1 = src1 + src1_stride;
        src0 = src0 + src0_stride;
        puVar60 = puVar60 + dst_stride;
      } while (iVar65 != h);
    }
  }
  else {
    if (subh != 1 || subw != 1) {
      aom_highbd_blend_a64_d16_mask_c
                (dst8,dst_stride,src0,src0_stride,src1,src1_stride,mask,mask_stride,w,h,subw,subh,
                 conv_params,bd);
      return;
    }
    if (w == 8) {
      auVar68 = pmovsxbw(in_XMM3,0x202020202020202);
      auVar73 = pmovsxbw(in_XMM4,0x4040404040404040);
      auVar130 = ZEXT416(uVar62);
      do {
        auVar70 = paddusb(*(undefined1 (*) [16])(*(undefined1 (*) [16])mask + mask_stride),
                          *(undefined1 (*) [16])mask);
        auVar71 = paddusb(*(undefined1 (*) [16])(*(undefined1 (*) [16])mask + mask_stride * 3),
                          *(undefined1 (*) [16])(*(undefined1 (*) [16])mask + mask_stride * 2));
        auVar70 = pmaddubsw(auVar70,auVar69);
        auVar71 = pmaddubsw(auVar71,auVar69);
        auVar91._0_2_ = (ushort)(auVar70._0_2_ + auVar68._0_2_) >> 2;
        auVar91._2_2_ = (ushort)(auVar70._2_2_ + auVar68._2_2_) >> 2;
        auVar91._4_2_ = (ushort)(auVar70._4_2_ + auVar68._4_2_) >> 2;
        auVar91._6_2_ = (ushort)(auVar70._6_2_ + auVar68._6_2_) >> 2;
        auVar91._8_2_ = (ushort)(auVar70._8_2_ + auVar68._8_2_) >> 2;
        auVar91._10_2_ = (ushort)(auVar70._10_2_ + auVar68._10_2_) >> 2;
        auVar91._12_2_ = (ushort)(auVar70._12_2_ + auVar68._12_2_) >> 2;
        auVar91._14_2_ = (ushort)(auVar70._14_2_ + auVar68._14_2_) >> 2;
        auVar100._0_2_ = (ushort)(auVar71._0_2_ + auVar68._0_2_) >> 2;
        auVar100._2_2_ = (ushort)(auVar71._2_2_ + auVar68._2_2_) >> 2;
        auVar100._4_2_ = (ushort)(auVar71._4_2_ + auVar68._4_2_) >> 2;
        auVar100._6_2_ = (ushort)(auVar71._6_2_ + auVar68._6_2_) >> 2;
        auVar100._8_2_ = (ushort)(auVar71._8_2_ + auVar68._8_2_) >> 2;
        auVar100._10_2_ = (ushort)(auVar71._10_2_ + auVar68._10_2_) >> 2;
        auVar100._12_2_ = (ushort)(auVar71._12_2_ + auVar68._12_2_) >> 2;
        auVar100._14_2_ = (ushort)(auVar71._14_2_ + auVar68._14_2_) >> 2;
        auVar70 = *(undefined1 (*) [16])src0;
        auVar71 = *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + (long)(int)src0_stride * 2);
        auVar72 = *(undefined1 (*) [16])src1;
        auVar164 = *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)(int)src1_stride * 2);
        auVar120._0_2_ = auVar73._0_2_ - auVar91._0_2_;
        auVar120._2_2_ = auVar73._2_2_ - auVar91._2_2_;
        auVar120._4_2_ = auVar73._4_2_ - auVar91._4_2_;
        auVar120._6_2_ = auVar73._6_2_ - auVar91._6_2_;
        auVar120._8_2_ = auVar73._8_2_ - auVar91._8_2_;
        auVar120._10_2_ = auVar73._10_2_ - auVar91._10_2_;
        auVar120._12_2_ = auVar73._12_2_ - auVar91._12_2_;
        auVar120._14_2_ = auVar73._14_2_ - auVar91._14_2_;
        auVar112._0_2_ = auVar73._0_2_ - auVar100._0_2_;
        auVar112._2_2_ = auVar73._2_2_ - auVar100._2_2_;
        auVar112._4_2_ = auVar73._4_2_ - auVar100._4_2_;
        auVar112._6_2_ = auVar73._6_2_ - auVar100._6_2_;
        auVar112._8_2_ = auVar73._8_2_ - auVar100._8_2_;
        auVar112._10_2_ = auVar73._10_2_ - auVar100._10_2_;
        auVar112._12_2_ = auVar73._12_2_ - auVar100._12_2_;
        auVar112._14_2_ = auVar73._14_2_ - auVar100._14_2_;
        auVar180 = pmulhuw(auVar91,auVar70);
        sVar95 = auVar91._6_2_ * auVar70._6_2_;
        iVar105 = CONCAT22(auVar180._8_2_,auVar91._8_2_ * auVar70._8_2_);
        auVar127._0_8_ = CONCAT26(auVar180._10_2_,CONCAT24(auVar91._10_2_ * auVar70._10_2_,iVar105))
        ;
        auVar127._8_2_ = auVar91._12_2_ * auVar70._12_2_;
        auVar127._10_2_ = auVar180._12_2_;
        auVar137._12_2_ = auVar91._14_2_ * auVar70._14_2_;
        auVar137._0_12_ = auVar127;
        auVar137._14_2_ = auVar180._14_2_;
        iVar65 = CONCAT22(auVar180._6_2_,sVar95);
        Var53 = CONCAT64(CONCAT42(iVar65,auVar180._4_2_),
                         CONCAT22(auVar91._4_2_ * auVar70._4_2_,sVar95));
        auVar45._4_8_ = (long)((unkuint10)Var53 >> 0x10);
        auVar45._2_2_ = auVar180._2_2_;
        auVar45._0_2_ = auVar91._2_2_ * auVar70._2_2_;
        auVar181 = pmulhuw(auVar120,auVar72);
        sVar95 = auVar120._6_2_ * auVar72._6_2_;
        iVar114 = CONCAT22(auVar181._8_2_,auVar120._8_2_ * auVar72._8_2_);
        auVar160._0_8_ =
             CONCAT26(auVar181._10_2_,CONCAT24(auVar120._10_2_ * auVar72._10_2_,iVar114));
        auVar160._8_2_ = auVar120._12_2_ * auVar72._12_2_;
        auVar160._10_2_ = auVar181._12_2_;
        auVar170._12_2_ = auVar120._14_2_ * auVar72._14_2_;
        auVar170._0_12_ = auVar160;
        auVar170._14_2_ = auVar181._14_2_;
        iVar57 = CONCAT22(auVar181._6_2_,sVar95);
        Var54 = CONCAT64(CONCAT42(iVar57,auVar181._4_2_),
                         CONCAT22(auVar120._4_2_ * auVar72._4_2_,sVar95));
        auVar46._4_8_ = (long)((unkuint10)Var54 >> 0x10);
        auVar46._2_2_ = auVar181._2_2_;
        auVar46._0_2_ = auVar120._2_2_ * auVar72._2_2_;
        auVar182 = pmulhuw(auVar100,auVar71);
        sVar95 = auVar100._6_2_ * auVar71._6_2_;
        iVar106 = CONCAT22(auVar182._8_2_,auVar100._8_2_ * auVar71._8_2_);
        auVar146._0_8_ =
             CONCAT26(auVar182._10_2_,CONCAT24(auVar100._10_2_ * auVar71._10_2_,iVar106));
        auVar146._8_2_ = auVar100._12_2_ * auVar71._12_2_;
        auVar146._10_2_ = auVar182._12_2_;
        auVar155._12_2_ = auVar100._14_2_ * auVar71._14_2_;
        auVar155._0_12_ = auVar146;
        auVar155._14_2_ = auVar182._14_2_;
        iVar58 = CONCAT22(auVar182._6_2_,sVar95);
        Var55 = CONCAT64(CONCAT42(iVar58,auVar182._4_2_),
                         CONCAT22(auVar100._4_2_ * auVar71._4_2_,sVar95));
        auVar47._4_8_ = (long)((unkuint10)Var55 >> 0x10);
        auVar47._2_2_ = auVar182._2_2_;
        auVar47._0_2_ = auVar100._2_2_ * auVar71._2_2_;
        auVar183 = pmulhuw(auVar112,auVar164);
        sVar95 = auVar112._6_2_ * auVar164._6_2_;
        iVar122 = CONCAT22(auVar183._8_2_,auVar112._8_2_ * auVar164._8_2_);
        auVar172._0_8_ =
             CONCAT26(auVar183._10_2_,CONCAT24(auVar112._10_2_ * auVar164._10_2_,iVar122));
        auVar172._8_2_ = auVar112._12_2_ * auVar164._12_2_;
        auVar172._10_2_ = auVar183._12_2_;
        auVar175._12_2_ = auVar112._14_2_ * auVar164._14_2_;
        auVar175._0_12_ = auVar172;
        auVar175._14_2_ = auVar183._14_2_;
        iVar104 = CONCAT22(auVar183._6_2_,sVar95);
        Var56 = CONCAT64(CONCAT42(iVar104,auVar183._4_2_),
                         CONCAT22(auVar112._4_2_ * auVar164._4_2_,sVar95));
        auVar48._4_8_ = (long)((unkuint10)Var56 >> 0x10);
        auVar48._2_2_ = auVar183._2_2_;
        auVar48._0_2_ = auVar112._2_2_ * auVar164._2_2_;
        auVar138._0_4_ = iVar105 + iVar64 + iVar114 >> auVar130;
        auVar138._4_4_ =
             (int)((ulong)auVar127._0_8_ >> 0x20) + iVar66 + (int)((ulong)auVar160._0_8_ >> 0x20) >>
             auVar130;
        auVar138._8_4_ = auVar127._8_4_ + iVar67 + auVar160._8_4_ >> auVar130;
        auVar138._12_4_ = auVar137._12_4_ + iVar59 + auVar170._12_4_ >> auVar130;
        auVar92._0_4_ =
             CONCAT22(auVar180._0_2_,auVar91._0_2_ * auVar70._0_2_) + iVar64 +
             CONCAT22(auVar181._0_2_,auVar120._0_2_ * auVar72._0_2_) >> auVar130;
        auVar92._4_4_ = auVar45._0_4_ + iVar66 + auVar46._0_4_ >> auVar130;
        auVar92._8_4_ =
             (int)((unkuint10)Var53 >> 0x10) + iVar67 + (int)((unkuint10)Var54 >> 0x10) >> auVar130;
        auVar92._12_4_ = iVar65 + iVar59 + iVar57 >> auVar130;
        auVar70 = packssdw(auVar92,auVar138);
        auVar156._0_4_ = iVar106 + iVar64 + iVar122 >> auVar130;
        auVar156._4_4_ =
             (int)((ulong)auVar146._0_8_ >> 0x20) + iVar66 + (int)((ulong)auVar172._0_8_ >> 0x20) >>
             auVar130;
        auVar156._8_4_ = auVar146._8_4_ + iVar67 + auVar172._8_4_ >> auVar130;
        auVar156._12_4_ = auVar155._12_4_ + iVar59 + auVar175._12_4_ >> auVar130;
        auVar101._0_4_ =
             CONCAT22(auVar182._0_2_,auVar100._0_2_ * auVar71._0_2_) + iVar64 +
             CONCAT22(auVar183._0_2_,auVar112._0_2_ * auVar164._0_2_) >> auVar130;
        auVar101._4_4_ = auVar47._0_4_ + iVar66 + auVar48._0_4_ >> auVar130;
        auVar101._8_4_ =
             (int)((unkuint10)Var55 >> 0x10) + iVar67 + (int)((unkuint10)Var56 >> 0x10) >> auVar130;
        auVar101._12_4_ = iVar58 + iVar59 + iVar104 >> auVar130;
        auVar71 = packssdw(auVar101,auVar156);
        sVar7 = (ushort)(-1 < auVar70._0_2_) * auVar70._0_2_;
        sVar6 = (ushort)(-1 < auVar70._2_2_) * auVar70._2_2_;
        sVar5 = (ushort)(-1 < auVar70._4_2_) * auVar70._4_2_;
        sVar4 = (ushort)(-1 < auVar70._6_2_) * auVar70._6_2_;
        sVar3 = (ushort)(-1 < auVar70._8_2_) * auVar70._8_2_;
        sVar95 = (ushort)(-1 < auVar70._10_2_) * auVar70._10_2_;
        sVar2 = (ushort)(-1 < auVar70._12_2_) * auVar70._12_2_;
        sVar1 = (ushort)(-1 < auVar70._14_2_) * auVar70._14_2_;
        sVar9 = (ushort)(-1 < auVar71._0_2_) * auVar71._0_2_;
        sVar10 = (ushort)(-1 < auVar71._2_2_) * auVar71._2_2_;
        sVar11 = (ushort)(-1 < auVar71._4_2_) * auVar71._4_2_;
        sVar15 = (ushort)(-1 < auVar71._6_2_) * auVar71._6_2_;
        sVar14 = (ushort)(-1 < auVar71._8_2_) * auVar71._8_2_;
        sVar13 = (ushort)(-1 < auVar71._10_2_) * auVar71._10_2_;
        sVar12 = (ushort)(-1 < auVar71._12_2_) * auVar71._12_2_;
        sVar8 = (ushort)(-1 < auVar71._14_2_) * auVar71._14_2_;
        *puVar60 = (ushort)(sVar25 < sVar7) * sVar25 | (ushort)(sVar25 >= sVar7) * sVar7;
        puVar60[1] = (ushort)(sVar26 < sVar6) * sVar26 | (ushort)(sVar26 >= sVar6) * sVar6;
        puVar60[2] = (ushort)(sVar25 < sVar5) * sVar25 | (ushort)(sVar25 >= sVar5) * sVar5;
        puVar60[3] = (ushort)(sVar26 < sVar4) * sVar26 | (ushort)(sVar26 >= sVar4) * sVar4;
        puVar60[4] = (ushort)(sVar25 < sVar3) * sVar25 | (ushort)(sVar25 >= sVar3) * sVar3;
        puVar60[5] = (ushort)(sVar26 < sVar95) * sVar26 | (ushort)(sVar26 >= sVar95) * sVar95;
        puVar60[6] = (ushort)(sVar25 < sVar2) * sVar25 | (ushort)(sVar25 >= sVar2) * sVar2;
        puVar60[7] = (ushort)(sVar26 < sVar1) * sVar26 | (ushort)(sVar26 >= sVar1) * sVar1;
        puVar16 = puVar60 + (int)dst_stride;
        *puVar16 = (ushort)(sVar25 < sVar9) * sVar25 | (ushort)(sVar25 >= sVar9) * sVar9;
        puVar16[1] = (ushort)(sVar26 < sVar10) * sVar26 | (ushort)(sVar26 >= sVar10) * sVar10;
        puVar16[2] = (ushort)(sVar25 < sVar11) * sVar25 | (ushort)(sVar25 >= sVar11) * sVar11;
        puVar16[3] = (ushort)(sVar26 < sVar15) * sVar26 | (ushort)(sVar26 >= sVar15) * sVar15;
        puVar16[4] = (ushort)(sVar25 < sVar14) * sVar25 | (ushort)(sVar25 >= sVar14) * sVar14;
        puVar16[5] = (ushort)(sVar26 < sVar13) * sVar26 | (ushort)(sVar26 >= sVar13) * sVar13;
        puVar16[6] = (ushort)(sVar25 < sVar12) * sVar25 | (ushort)(sVar25 >= sVar12) * sVar12;
        puVar16[7] = (ushort)(sVar26 < sVar8) * sVar26 | (ushort)(sVar26 >= sVar8) * sVar8;
        mask = *(undefined1 (*) [16])mask + (mask_stride << 2);
        src1 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src1 + (ulong)(src1_stride * 2) * 2);
        src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src0 + (ulong)(src0_stride * 2) * 2);
        puVar60 = puVar60 + dst_stride * 2;
        h = h + -2;
      } while (h != 0);
    }
    else if (w == 4) {
      auVar69 = ZEXT416(uVar62);
      auVar68 = pmovsxbw(in_XMM4,0x202020202020202);
      auVar73 = pmovsxbw(in_XMM5,0x4040404040404040);
      do {
        auVar87._8_8_ = *(undefined8 *)mask;
        auVar87._0_8_ = *(undefined8 *)(mask + mask_stride * 2);
        auVar129._8_8_ = *(undefined8 *)(mask + mask_stride);
        auVar129._0_8_ = *(undefined8 *)(mask + mask_stride * 3);
        auVar130 = paddusb(auVar129,auVar87);
        auVar130 = pmaddubsw(auVar130,_DAT_004c9fd0);
        auVar131._0_2_ = (ushort)(auVar130._0_2_ + auVar68._0_2_) >> 2;
        auVar131._2_2_ = (ushort)(auVar130._2_2_ + auVar68._2_2_) >> 2;
        auVar131._4_2_ = (ushort)(auVar130._4_2_ + auVar68._4_2_) >> 2;
        auVar131._6_2_ = (ushort)(auVar130._6_2_ + auVar68._6_2_) >> 2;
        auVar131._8_2_ = (ushort)(auVar130._8_2_ + auVar68._8_2_) >> 2;
        auVar131._10_2_ = (ushort)(auVar130._10_2_ + auVar68._10_2_) >> 2;
        auVar131._12_2_ = (ushort)(auVar130._12_2_ + auVar68._12_2_) >> 2;
        auVar131._14_2_ = (ushort)(auVar130._14_2_ + auVar68._14_2_) >> 2;
        auVar96._8_8_ = *(undefined8 *)(mask + mask_stride * 4);
        auVar96._0_8_ = *(undefined8 *)(mask + mask_stride * 6);
        auVar148._8_8_ = *(undefined8 *)(mask + mask_stride * 5);
        auVar148._0_8_ = *(undefined8 *)(mask + mask_stride * 7);
        auVar130 = paddusb(auVar148,auVar96);
        auVar130 = pmaddubsw(auVar130,_DAT_004c9fd0);
        auVar149._0_2_ = (ushort)(auVar130._0_2_ + auVar68._0_2_) >> 2;
        auVar149._2_2_ = (ushort)(auVar130._2_2_ + auVar68._2_2_) >> 2;
        auVar149._4_2_ = (ushort)(auVar130._4_2_ + auVar68._4_2_) >> 2;
        auVar149._6_2_ = (ushort)(auVar130._6_2_ + auVar68._6_2_) >> 2;
        auVar149._8_2_ = (ushort)(auVar130._8_2_ + auVar68._8_2_) >> 2;
        auVar149._10_2_ = (ushort)(auVar130._10_2_ + auVar68._10_2_) >> 2;
        auVar149._12_2_ = (ushort)(auVar130._12_2_ + auVar68._12_2_) >> 2;
        auVar149._14_2_ = (ushort)(auVar130._14_2_ + auVar68._14_2_) >> 2;
        uVar17 = *(undefined8 *)(src0 + (int)src0_stride);
        uVar18 = *(undefined8 *)src0;
        auVar88._8_8_ = uVar18;
        auVar88._0_8_ = uVar17;
        uVar19 = *(undefined8 *)(src0 + (int)(src0_stride * 2));
        uVar20 = *(undefined8 *)(src0 + (int)(src0_stride * 3));
        auVar97._8_8_ = uVar19;
        auVar97._0_8_ = uVar20;
        uVar21 = *(undefined8 *)(src1 + (int)src1_stride);
        uVar22 = *(undefined8 *)src1;
        auVar178._8_8_ = uVar22;
        auVar178._0_8_ = uVar21;
        uVar23 = *(undefined8 *)(src1 + (int)(src1_stride * 2));
        uVar24 = *(undefined8 *)(src1 + (int)(src1_stride * 3));
        auVar174._8_8_ = uVar23;
        auVar174._0_8_ = uVar24;
        auVar118._0_2_ = auVar73._0_2_ - auVar131._0_2_;
        auVar118._2_2_ = auVar73._2_2_ - auVar131._2_2_;
        auVar118._4_2_ = auVar73._4_2_ - auVar131._4_2_;
        auVar118._6_2_ = auVar73._6_2_ - auVar131._6_2_;
        auVar118._8_2_ = auVar73._8_2_ - auVar131._8_2_;
        auVar118._10_2_ = auVar73._10_2_ - auVar131._10_2_;
        auVar118._12_2_ = auVar73._12_2_ - auVar131._12_2_;
        auVar118._14_2_ = auVar73._14_2_ - auVar131._14_2_;
        auVar110._0_2_ = auVar73._0_2_ - auVar149._0_2_;
        auVar110._2_2_ = auVar73._2_2_ - auVar149._2_2_;
        auVar110._4_2_ = auVar73._4_2_ - auVar149._4_2_;
        auVar110._6_2_ = auVar73._6_2_ - auVar149._6_2_;
        auVar110._8_2_ = auVar73._8_2_ - auVar149._8_2_;
        auVar110._10_2_ = auVar73._10_2_ - auVar149._10_2_;
        auVar110._12_2_ = auVar73._12_2_ - auVar149._12_2_;
        auVar110._14_2_ = auVar73._14_2_ - auVar149._14_2_;
        auVar130 = pmulhuw(auVar131,auVar88);
        sVar95 = (short)((ulong)uVar17 >> 0x30) * auVar131._6_2_;
        iVar106 = CONCAT22(auVar130._8_2_,(short)uVar18 * auVar131._8_2_);
        auVar159._0_8_ =
             CONCAT26(auVar130._10_2_,
                      CONCAT24((short)((ulong)uVar18 >> 0x10) * auVar131._10_2_,iVar106));
        auVar159._8_2_ = (short)((ulong)uVar18 >> 0x20) * auVar131._12_2_;
        auVar159._10_2_ = auVar130._12_2_;
        auVar162._12_2_ = (short)((ulong)uVar18 >> 0x30) * auVar131._14_2_;
        auVar162._0_12_ = auVar159;
        auVar162._14_2_ = auVar130._14_2_;
        iVar65 = CONCAT22(auVar130._6_2_,sVar95);
        Var53 = CONCAT64(CONCAT42(iVar65,auVar130._4_2_),
                         CONCAT22((short)((ulong)uVar17 >> 0x20) * auVar131._4_2_,sVar95));
        auVar29._4_8_ = (long)((unkuint10)Var53 >> 0x10);
        auVar29._2_2_ = auVar130._2_2_;
        auVar29._0_2_ = (short)((ulong)uVar17 >> 0x10) * auVar131._2_2_;
        auVar70 = pmulhuw(auVar118,auVar178);
        sVar95 = auVar118._6_2_ * (short)((ulong)uVar21 >> 0x30);
        iVar114 = CONCAT22(auVar70._8_2_,auVar118._8_2_ * (short)uVar22);
        auVar177._0_8_ =
             CONCAT26(auVar70._10_2_,
                      CONCAT24(auVar118._10_2_ * (short)((ulong)uVar22 >> 0x10),iVar114));
        auVar177._8_2_ = auVar118._12_2_ * (short)((ulong)uVar22 >> 0x20);
        auVar177._10_2_ = auVar70._12_2_;
        auVar179._12_2_ = auVar118._14_2_ * (short)((ulong)uVar22 >> 0x30);
        auVar179._0_12_ = auVar177;
        auVar179._14_2_ = auVar70._14_2_;
        iVar57 = CONCAT22(auVar70._6_2_,sVar95);
        Var54 = CONCAT64(CONCAT42(iVar57,auVar70._4_2_),
                         CONCAT22(auVar118._4_2_ * (short)((ulong)uVar21 >> 0x20),sVar95));
        auVar30._4_8_ = (long)((unkuint10)Var54 >> 0x10);
        auVar30._2_2_ = auVar70._2_2_;
        auVar30._0_2_ = auVar118._2_2_ * (short)((ulong)uVar21 >> 0x10);
        auVar71 = pmulhuw(auVar149,auVar97);
        sVar95 = (short)((ulong)uVar20 >> 0x30) * auVar149._6_2_;
        iVar104 = CONCAT22(auVar71._8_2_,(short)uVar19 * auVar149._8_2_);
        auVar123._0_8_ =
             CONCAT26(auVar71._10_2_,
                      CONCAT24((short)((ulong)uVar19 >> 0x10) * auVar149._10_2_,iVar104));
        auVar123._8_2_ = (short)((ulong)uVar19 >> 0x20) * auVar149._12_2_;
        auVar123._10_2_ = auVar71._12_2_;
        auVar132._12_2_ = (short)((ulong)uVar19 >> 0x30) * auVar149._14_2_;
        auVar132._0_12_ = auVar123;
        auVar132._14_2_ = auVar71._14_2_;
        iVar58 = CONCAT22(auVar71._6_2_,sVar95);
        Var55 = CONCAT64(CONCAT42(iVar58,auVar71._4_2_),
                         CONCAT22((short)((ulong)uVar20 >> 0x20) * auVar149._4_2_,sVar95));
        auVar31._4_8_ = (long)((unkuint10)Var55 >> 0x10);
        auVar31._2_2_ = auVar71._2_2_;
        auVar31._0_2_ = (short)((ulong)uVar20 >> 0x10) * auVar149._2_2_;
        auVar72 = pmulhuw(auVar110,auVar174);
        sVar95 = auVar110._6_2_ * (short)((ulong)uVar24 >> 0x30);
        iVar105 = CONCAT22(auVar72._8_2_,auVar110._8_2_ * (short)uVar23);
        auVar142._0_8_ =
             CONCAT26(auVar72._10_2_,
                      CONCAT24(auVar110._10_2_ * (short)((ulong)uVar23 >> 0x10),iVar105));
        auVar142._8_2_ = auVar110._12_2_ * (short)((ulong)uVar23 >> 0x20);
        auVar142._10_2_ = auVar72._12_2_;
        auVar150._12_2_ = auVar110._14_2_ * (short)((ulong)uVar23 >> 0x30);
        auVar150._0_12_ = auVar142;
        auVar150._14_2_ = auVar72._14_2_;
        auVar163._0_4_ = iVar106 + iVar64 + iVar114 >> auVar69;
        auVar163._4_4_ =
             (int)((ulong)auVar159._0_8_ >> 0x20) + iVar66 + (int)((ulong)auVar177._0_8_ >> 0x20) >>
             auVar69;
        auVar163._8_4_ = auVar159._8_4_ + iVar67 + auVar177._8_4_ >> auVar69;
        auVar163._12_4_ = auVar162._12_4_ + iVar59 + auVar179._12_4_ >> auVar69;
        auVar133._0_4_ = iVar104 + iVar64 + iVar105 >> auVar69;
        auVar133._4_4_ =
             (int)((ulong)auVar123._0_8_ >> 0x20) + iVar66 + (int)((ulong)auVar142._0_8_ >> 0x20) >>
             auVar69;
        auVar133._8_4_ = auVar123._8_4_ + iVar67 + auVar142._8_4_ >> auVar69;
        auVar133._12_4_ = auVar132._12_4_ + iVar59 + auVar150._12_4_ >> auVar69;
        auVar89._0_4_ =
             CONCAT22(auVar130._0_2_,(short)uVar17 * auVar131._0_2_) + iVar64 +
             CONCAT22(auVar70._0_2_,auVar118._0_2_ * (short)uVar21) >> auVar69;
        auVar89._4_4_ = auVar29._0_4_ + iVar66 + auVar30._0_4_ >> auVar69;
        auVar89._8_4_ =
             (int)((unkuint10)Var53 >> 0x10) + iVar67 + (int)((unkuint10)Var54 >> 0x10) >> auVar69;
        auVar89._12_4_ = iVar65 + iVar59 + iVar57 >> auVar69;
        iVar65 = CONCAT22(auVar72._6_2_,sVar95);
        Var53 = CONCAT64(CONCAT42(iVar65,auVar72._4_2_),
                         CONCAT22(auVar110._4_2_ * (short)((ulong)uVar24 >> 0x20),sVar95));
        auVar32._4_8_ = (long)((unkuint10)Var53 >> 0x10);
        auVar32._2_2_ = auVar72._2_2_;
        auVar32._0_2_ = auVar110._2_2_ * (short)((ulong)uVar24 >> 0x10);
        auVar130 = packssdw(auVar89,auVar163);
        auVar98._0_4_ =
             CONCAT22(auVar71._0_2_,(short)uVar20 * auVar149._0_2_) + iVar64 +
             CONCAT22(auVar72._0_2_,auVar110._0_2_ * (short)uVar24) >> auVar69;
        auVar98._4_4_ = auVar31._0_4_ + iVar66 + auVar32._0_4_ >> auVar69;
        auVar98._8_4_ =
             (int)((unkuint10)Var55 >> 0x10) + iVar67 + (int)((unkuint10)Var53 >> 0x10) >> auVar69;
        auVar98._12_4_ = iVar58 + iVar59 + iVar65 >> auVar69;
        sVar1 = (ushort)(-1 < auVar130._0_2_) * auVar130._0_2_;
        sVar2 = (ushort)(-1 < auVar130._2_2_) * auVar130._2_2_;
        sVar3 = (ushort)(-1 < auVar130._4_2_) * auVar130._4_2_;
        sVar4 = (ushort)(-1 < auVar130._6_2_) * auVar130._6_2_;
        sVar5 = (ushort)(-1 < auVar130._8_2_) * auVar130._8_2_;
        sVar6 = (ushort)(-1 < auVar130._10_2_) * auVar130._10_2_;
        sVar7 = (ushort)(-1 < auVar130._12_2_) * auVar130._12_2_;
        sVar95 = (ushort)(-1 < auVar130._14_2_) * auVar130._14_2_;
        puVar60[4] = (ushort)(sVar25 < sVar5) * sVar25 | (ushort)(sVar25 >= sVar5) * sVar5;
        puVar60[5] = (ushort)(sVar26 < sVar6) * sVar26 | (ushort)(sVar26 >= sVar6) * sVar6;
        puVar60[6] = (ushort)(sVar25 < sVar7) * sVar25 | (ushort)(sVar25 >= sVar7) * sVar7;
        puVar60[7] = (ushort)(sVar26 < sVar95) * sVar26 | (ushort)(sVar26 >= sVar95) * sVar95;
        auVar130 = packssdw(auVar98,auVar133);
        sVar95 = (ushort)(-1 < auVar130._0_2_) * auVar130._0_2_;
        sVar6 = (ushort)(-1 < auVar130._2_2_) * auVar130._2_2_;
        sVar7 = (ushort)(-1 < auVar130._4_2_) * auVar130._4_2_;
        sVar8 = (ushort)(-1 < auVar130._6_2_) * auVar130._6_2_;
        sVar9 = (ushort)(-1 < auVar130._8_2_) * auVar130._8_2_;
        sVar10 = (ushort)(-1 < auVar130._10_2_) * auVar130._10_2_;
        sVar11 = (ushort)(-1 < auVar130._12_2_) * auVar130._12_2_;
        sVar5 = (ushort)(-1 < auVar130._14_2_) * auVar130._14_2_;
        puVar16 = puVar60 + (int)dst_stride;
        *puVar16 = (ushort)(sVar25 < sVar1) * sVar25 | (ushort)(sVar25 >= sVar1) * sVar1;
        puVar16[1] = (ushort)(sVar26 < sVar2) * sVar26 | (ushort)(sVar26 >= sVar2) * sVar2;
        puVar16[2] = (ushort)(sVar25 < sVar3) * sVar25 | (ushort)(sVar25 >= sVar3) * sVar3;
        puVar16[3] = (ushort)(sVar26 < sVar4) * sVar26 | (ushort)(sVar26 >= sVar4) * sVar4;
        puVar60[(long)(int)(dst_stride * 2) + 4] =
             (ushort)(sVar25 < sVar9) * sVar25 | (ushort)(sVar25 >= sVar9) * sVar9;
        puVar60[(long)(int)(dst_stride * 2) + 5] =
             (ushort)(sVar26 < sVar10) * sVar26 | (ushort)(sVar26 >= sVar10) * sVar10;
        puVar60[(long)(int)(dst_stride * 2) + 6] =
             (ushort)(sVar25 < sVar11) * sVar25 | (ushort)(sVar25 >= sVar11) * sVar11;
        puVar60[(long)(int)(dst_stride * 2) + 7] =
             (ushort)(sVar26 < sVar5) * sVar26 | (ushort)(sVar26 >= sVar5) * sVar5;
        puVar16 = puVar60 + (int)(dst_stride * 3);
        *puVar16 = (ushort)(sVar25 < sVar95) * sVar25 | (ushort)(sVar25 >= sVar95) * sVar95;
        puVar16[1] = (ushort)(sVar26 < sVar6) * sVar26 | (ushort)(sVar26 >= sVar6) * sVar6;
        puVar16[2] = (ushort)(sVar25 < sVar7) * sVar25 | (ushort)(sVar25 >= sVar7) * sVar7;
        puVar16[3] = (ushort)(sVar26 < sVar8) * sVar26 | (ushort)(sVar26 >= sVar8) * sVar8;
        mask = mask + mask_stride * 8;
        src1 = src1 + (src1_stride << 2);
        src0 = src0 + (src0_stride << 2);
        puVar60 = puVar60 + (dst_stride << 2);
        h = h + -4;
      } while (h != 0);
    }
    else if (0 < h) {
      puVar63 = mask + (ulong)mask_stride + 0x10;
      iVar65 = 0;
      auVar68 = pmovsxbw(in_XMM3,0x202020202020202);
      auVar73 = pmovsxbw(in_XMM4,0x4040404040404040);
      auVar130 = ZEXT416(uVar62);
      do {
        if (0 < w) {
          lVar61 = 0;
          do {
            auVar70 = paddusb(*(undefined1 (*) [16])(puVar63 + lVar61 * 2 + -0x10),
                              *(undefined1 (*) [16])(mask + lVar61 * 2));
            auVar71 = paddusb(*(undefined1 (*) [16])(puVar63 + lVar61 * 2),
                              *(undefined1 (*) [16])(mask + lVar61 * 2 + 0x10));
            auVar70 = pmaddubsw(auVar70,auVar69);
            auVar71 = pmaddubsw(auVar71,auVar69);
            auVar93._0_2_ = (ushort)(auVar70._0_2_ + auVar68._0_2_) >> 2;
            auVar93._2_2_ = (ushort)(auVar70._2_2_ + auVar68._2_2_) >> 2;
            auVar93._4_2_ = (ushort)(auVar70._4_2_ + auVar68._4_2_) >> 2;
            auVar93._6_2_ = (ushort)(auVar70._6_2_ + auVar68._6_2_) >> 2;
            auVar93._8_2_ = (ushort)(auVar70._8_2_ + auVar68._8_2_) >> 2;
            auVar93._10_2_ = (ushort)(auVar70._10_2_ + auVar68._10_2_) >> 2;
            auVar93._12_2_ = (ushort)(auVar70._12_2_ + auVar68._12_2_) >> 2;
            auVar93._14_2_ = (ushort)(auVar70._14_2_ + auVar68._14_2_) >> 2;
            auVar102._0_2_ = (ushort)(auVar71._0_2_ + auVar68._0_2_) >> 2;
            auVar102._2_2_ = (ushort)(auVar71._2_2_ + auVar68._2_2_) >> 2;
            auVar102._4_2_ = (ushort)(auVar71._4_2_ + auVar68._4_2_) >> 2;
            auVar102._6_2_ = (ushort)(auVar71._6_2_ + auVar68._6_2_) >> 2;
            auVar102._8_2_ = (ushort)(auVar71._8_2_ + auVar68._8_2_) >> 2;
            auVar102._10_2_ = (ushort)(auVar71._10_2_ + auVar68._10_2_) >> 2;
            auVar102._12_2_ = (ushort)(auVar71._12_2_ + auVar68._12_2_) >> 2;
            auVar102._14_2_ = (ushort)(auVar71._14_2_ + auVar68._14_2_) >> 2;
            auVar70 = *(undefined1 (*) [16])(src0 + lVar61);
            auVar71 = *(undefined1 (*) [16])(src0 + lVar61 + 8);
            auVar72 = *(undefined1 (*) [16])(src1 + lVar61);
            auVar164 = *(undefined1 (*) [16])(src1 + lVar61 + 8);
            auVar121._0_2_ = auVar73._0_2_ - auVar102._0_2_;
            auVar121._2_2_ = auVar73._2_2_ - auVar102._2_2_;
            auVar121._4_2_ = auVar73._4_2_ - auVar102._4_2_;
            auVar121._6_2_ = auVar73._6_2_ - auVar102._6_2_;
            auVar121._8_2_ = auVar73._8_2_ - auVar102._8_2_;
            auVar121._10_2_ = auVar73._10_2_ - auVar102._10_2_;
            auVar121._12_2_ = auVar73._12_2_ - auVar102._12_2_;
            auVar121._14_2_ = auVar73._14_2_ - auVar102._14_2_;
            auVar113._0_2_ = auVar73._0_2_ - auVar93._0_2_;
            auVar113._2_2_ = auVar73._2_2_ - auVar93._2_2_;
            auVar113._4_2_ = auVar73._4_2_ - auVar93._4_2_;
            auVar113._6_2_ = auVar73._6_2_ - auVar93._6_2_;
            auVar113._8_2_ = auVar73._8_2_ - auVar93._8_2_;
            auVar113._10_2_ = auVar73._10_2_ - auVar93._10_2_;
            auVar113._12_2_ = auVar73._12_2_ - auVar93._12_2_;
            auVar113._14_2_ = auVar73._14_2_ - auVar93._14_2_;
            auVar180 = pmulhuw(auVar102,auVar71);
            sVar95 = auVar102._6_2_ * auVar71._6_2_;
            iVar106 = CONCAT22(auVar180._8_2_,auVar102._8_2_ * auVar71._8_2_);
            auVar128._0_8_ =
                 CONCAT26(auVar180._10_2_,CONCAT24(auVar102._10_2_ * auVar71._10_2_,iVar106));
            auVar128._8_2_ = auVar102._12_2_ * auVar71._12_2_;
            auVar128._10_2_ = auVar180._12_2_;
            auVar139._12_2_ = auVar102._14_2_ * auVar71._14_2_;
            auVar139._0_12_ = auVar128;
            auVar139._14_2_ = auVar180._14_2_;
            iVar57 = CONCAT22(auVar180._6_2_,sVar95);
            Var53 = CONCAT64(CONCAT42(iVar57,auVar180._4_2_),
                             CONCAT22(auVar102._4_2_ * auVar71._4_2_,sVar95));
            auVar49._4_8_ = (long)((unkuint10)Var53 >> 0x10);
            auVar49._2_2_ = auVar180._2_2_;
            auVar49._0_2_ = auVar102._2_2_ * auVar71._2_2_;
            auVar181 = pmulhuw(auVar121,auVar164);
            sVar95 = auVar121._6_2_ * auVar164._6_2_;
            iVar141 = CONCAT22(auVar181._8_2_,auVar121._8_2_ * auVar164._8_2_);
            auVar173._0_8_ =
                 CONCAT26(auVar181._10_2_,CONCAT24(auVar121._10_2_ * auVar164._10_2_,iVar141));
            auVar173._8_2_ = auVar121._12_2_ * auVar164._12_2_;
            auVar173._10_2_ = auVar181._12_2_;
            auVar176._12_2_ = auVar121._14_2_ * auVar164._14_2_;
            auVar176._0_12_ = auVar173;
            auVar176._14_2_ = auVar181._14_2_;
            iVar58 = CONCAT22(auVar181._6_2_,sVar95);
            Var54 = CONCAT64(CONCAT42(iVar58,auVar181._4_2_),
                             CONCAT22(auVar121._4_2_ * auVar164._4_2_,sVar95));
            auVar50._4_8_ = (long)((unkuint10)Var54 >> 0x10);
            auVar50._2_2_ = auVar181._2_2_;
            auVar50._0_2_ = auVar121._2_2_ * auVar164._2_2_;
            auVar182 = pmulhuw(auVar93,auVar70);
            sVar95 = auVar93._6_2_ * auVar70._6_2_;
            iVar114 = CONCAT22(auVar182._8_2_,auVar93._8_2_ * auVar70._8_2_);
            auVar147._0_8_ =
                 CONCAT26(auVar182._10_2_,CONCAT24(auVar93._10_2_ * auVar70._10_2_,iVar114));
            auVar147._8_2_ = auVar93._12_2_ * auVar70._12_2_;
            auVar147._10_2_ = auVar182._12_2_;
            auVar157._12_2_ = auVar93._14_2_ * auVar70._14_2_;
            auVar157._0_12_ = auVar147;
            auVar157._14_2_ = auVar182._14_2_;
            iVar104 = CONCAT22(auVar182._6_2_,sVar95);
            Var55 = CONCAT64(CONCAT42(iVar104,auVar182._4_2_),
                             CONCAT22(auVar93._4_2_ * auVar70._4_2_,sVar95));
            auVar51._4_8_ = (long)((unkuint10)Var55 >> 0x10);
            auVar51._2_2_ = auVar182._2_2_;
            auVar51._0_2_ = auVar93._2_2_ * auVar70._2_2_;
            auVar183 = pmulhuw(auVar113,auVar72);
            sVar95 = auVar113._6_2_ * auVar72._6_2_;
            iVar122 = CONCAT22(auVar183._8_2_,auVar113._8_2_ * auVar72._8_2_);
            auVar161._0_8_ =
                 CONCAT26(auVar183._10_2_,CONCAT24(auVar113._10_2_ * auVar72._10_2_,iVar122));
            auVar161._8_2_ = auVar113._12_2_ * auVar72._12_2_;
            auVar161._10_2_ = auVar183._12_2_;
            auVar171._12_2_ = auVar113._14_2_ * auVar72._14_2_;
            auVar171._0_12_ = auVar161;
            auVar171._14_2_ = auVar183._14_2_;
            iVar105 = CONCAT22(auVar183._6_2_,sVar95);
            Var56 = CONCAT64(CONCAT42(iVar105,auVar183._4_2_),
                             CONCAT22(auVar113._4_2_ * auVar72._4_2_,sVar95));
            auVar52._4_8_ = (long)((unkuint10)Var56 >> 0x10);
            auVar52._2_2_ = auVar183._2_2_;
            auVar52._0_2_ = auVar113._2_2_ * auVar72._2_2_;
            auVar140._0_4_ = iVar106 + iVar64 + iVar141 >> auVar130;
            auVar140._4_4_ =
                 (int)((ulong)auVar128._0_8_ >> 0x20) + iVar66 +
                 (int)((ulong)auVar173._0_8_ >> 0x20) >> auVar130;
            auVar140._8_4_ = auVar128._8_4_ + iVar67 + auVar173._8_4_ >> auVar130;
            auVar140._12_4_ = auVar139._12_4_ + iVar59 + auVar176._12_4_ >> auVar130;
            auVar103._0_4_ =
                 CONCAT22(auVar180._0_2_,auVar102._0_2_ * auVar71._0_2_) + iVar64 +
                 CONCAT22(auVar181._0_2_,auVar121._0_2_ * auVar164._0_2_) >> auVar130;
            auVar103._4_4_ = auVar49._0_4_ + iVar66 + auVar50._0_4_ >> auVar130;
            auVar103._8_4_ =
                 (int)((unkuint10)Var53 >> 0x10) + iVar67 + (int)((unkuint10)Var54 >> 0x10) >>
                 auVar130;
            auVar103._12_4_ = iVar57 + iVar59 + iVar58 >> auVar130;
            auVar71 = packssdw(auVar103,auVar140);
            auVar158._0_4_ = iVar114 + iVar64 + iVar122 >> auVar130;
            auVar158._4_4_ =
                 (int)((ulong)auVar147._0_8_ >> 0x20) + iVar66 +
                 (int)((ulong)auVar161._0_8_ >> 0x20) >> auVar130;
            auVar158._8_4_ = auVar147._8_4_ + iVar67 + auVar161._8_4_ >> auVar130;
            auVar158._12_4_ = auVar157._12_4_ + iVar59 + auVar171._12_4_ >> auVar130;
            auVar94._0_4_ =
                 CONCAT22(auVar182._0_2_,auVar93._0_2_ * auVar70._0_2_) + iVar64 +
                 CONCAT22(auVar183._0_2_,auVar113._0_2_ * auVar72._0_2_) >> auVar130;
            auVar94._4_4_ = auVar51._0_4_ + iVar66 + auVar52._0_4_ >> auVar130;
            auVar94._8_4_ =
                 (int)((unkuint10)Var55 >> 0x10) + iVar67 + (int)((unkuint10)Var56 >> 0x10) >>
                 auVar130;
            auVar94._12_4_ = iVar104 + iVar59 + iVar105 >> auVar130;
            auVar70 = packssdw(auVar94,auVar158);
            sVar5 = (ushort)(-1 < auVar71._0_2_) * auVar71._0_2_;
            sVar95 = (ushort)(-1 < auVar71._2_2_) * auVar71._2_2_;
            sVar6 = (ushort)(-1 < auVar71._4_2_) * auVar71._4_2_;
            sVar4 = (ushort)(-1 < auVar71._6_2_) * auVar71._6_2_;
            sVar3 = (ushort)(-1 < auVar71._8_2_) * auVar71._8_2_;
            sVar7 = (ushort)(-1 < auVar71._10_2_) * auVar71._10_2_;
            sVar2 = (ushort)(-1 < auVar71._12_2_) * auVar71._12_2_;
            sVar1 = (ushort)(-1 < auVar71._14_2_) * auVar71._14_2_;
            sVar12 = (ushort)(-1 < auVar70._0_2_) * auVar70._0_2_;
            sVar13 = (ushort)(-1 < auVar70._2_2_) * auVar70._2_2_;
            sVar14 = (ushort)(-1 < auVar70._4_2_) * auVar70._4_2_;
            sVar15 = (ushort)(-1 < auVar70._6_2_) * auVar70._6_2_;
            sVar11 = (ushort)(-1 < auVar70._8_2_) * auVar70._8_2_;
            sVar8 = (ushort)(-1 < auVar70._10_2_) * auVar70._10_2_;
            sVar10 = (ushort)(-1 < auVar70._12_2_) * auVar70._12_2_;
            sVar9 = (ushort)(-1 < auVar70._14_2_) * auVar70._14_2_;
            puVar16 = puVar60 + lVar61;
            *puVar16 = (ushort)(sVar25 < sVar12) * sVar25 | (ushort)(sVar25 >= sVar12) * sVar12;
            puVar16[1] = (ushort)(sVar26 < sVar13) * sVar26 | (ushort)(sVar26 >= sVar13) * sVar13;
            puVar16[2] = (ushort)(sVar25 < sVar14) * sVar25 | (ushort)(sVar25 >= sVar14) * sVar14;
            puVar16[3] = (ushort)(sVar26 < sVar15) * sVar26 | (ushort)(sVar26 >= sVar15) * sVar15;
            puVar16[4] = (ushort)(sVar25 < sVar11) * sVar25 | (ushort)(sVar25 >= sVar11) * sVar11;
            puVar16[5] = (ushort)(sVar26 < sVar8) * sVar26 | (ushort)(sVar26 >= sVar8) * sVar8;
            puVar16[6] = (ushort)(sVar25 < sVar10) * sVar25 | (ushort)(sVar25 >= sVar10) * sVar10;
            puVar16[7] = (ushort)(sVar26 < sVar9) * sVar26 | (ushort)(sVar26 >= sVar9) * sVar9;
            puVar16 = puVar60 + lVar61 + 8;
            *puVar16 = (ushort)(sVar25 < sVar5) * sVar25 | (ushort)(sVar25 >= sVar5) * sVar5;
            puVar16[1] = (ushort)(sVar26 < sVar95) * sVar26 | (ushort)(sVar26 >= sVar95) * sVar95;
            puVar16[2] = (ushort)(sVar25 < sVar6) * sVar25 | (ushort)(sVar25 >= sVar6) * sVar6;
            puVar16[3] = (ushort)(sVar26 < sVar4) * sVar26 | (ushort)(sVar26 >= sVar4) * sVar4;
            puVar16[4] = (ushort)(sVar25 < sVar3) * sVar25 | (ushort)(sVar25 >= sVar3) * sVar3;
            puVar16[5] = (ushort)(sVar26 < sVar7) * sVar26 | (ushort)(sVar26 >= sVar7) * sVar7;
            puVar16[6] = (ushort)(sVar25 < sVar2) * sVar25 | (ushort)(sVar25 >= sVar2) * sVar2;
            puVar16[7] = (ushort)(sVar26 < sVar1) * sVar26 | (ushort)(sVar26 >= sVar1) * sVar1;
            lVar61 = lVar61 + 0x10;
          } while (lVar61 < w);
        }
        mask = mask + mask_stride * 2;
        iVar65 = iVar65 + 1;
        src1 = src1 + src1_stride;
        src0 = src0 + src0_stride;
        puVar60 = puVar60 + dst_stride;
        puVar63 = puVar63 + mask_stride * 2;
      } while (iVar65 != h);
    }
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_d16_mask_sse4_1(
    uint8_t *dst8, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params, const int bd) {
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int32_t round_offset =
      ((1 << (round_bits + bd)) + (1 << (round_bits + bd - 1)) -
       (1 << (round_bits - 1)))
      << AOM_BLEND_A64_ROUND_BITS;
  const __m128i v_round_offset = _mm_set1_epi32(round_offset);
  const int shift = round_bits + AOM_BLEND_A64_ROUND_BITS;

  const __m128i clip_low = _mm_setzero_si128();
  const __m128i clip_high = _mm_set1_epi16((1 << bd) - 1);
  const __m128i mask_max = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  assert(IMPLIES((void *)src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES((void *)src1 == dst, src1_stride == dst_stride));

  assert(h >= 4);
  assert(w >= 4);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  if (subw == 0 && subh == 0) {
    switch (w) {
      case 4:
        highbd_blend_a64_d16_mask_subw0_subh0_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      case 8:
        highbd_blend_a64_d16_mask_subw0_subh0_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      default:  // >=16
        highbd_blend_a64_d16_mask_subw0_subh0_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
    }

  } else if (subw == 1 && subh == 1) {
    switch (w) {
      case 4:
        highbd_blend_a64_d16_mask_subw1_subh1_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      case 8:
        highbd_blend_a64_d16_mask_subw1_subh1_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
      default:  // >=16
        highbd_blend_a64_d16_mask_subw1_subh1_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift, &clip_low, &clip_high,
            &mask_max);
        break;
    }
  } else {
    // Sub-sampling in only one axis doesn't seem to happen very much, so fall
    // back to the vanilla C implementation instead of having all the optimised
    // code for these.
    aom_highbd_blend_a64_d16_mask_c(dst8, dst_stride, src0, src0_stride, src1,
                                    src1_stride, mask, mask_stride, w, h, subw,
                                    subh, conv_params, bd);
  }
}